

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall Node::addDestNode(Node *this,Node *n)

{
  Node *local_8;
  
  local_8 = n;
  std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
            ((vector<Node*,std::allocator<Node*>> *)&this->_nodes,&local_8);
  return;
}

Assistant:

void Node::addDestNode(Node &n)
{
    _nodes.push_back(&n);
}